

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.h
# Opt level: O0

void sip_round(siphash *H,int rounds)

{
  int local_18;
  int i;
  int rounds_local;
  siphash *H_local;
  
  for (local_18 = 0; local_18 < rounds; local_18 = local_18 + 1) {
    H->v0 = H->v1 + H->v0;
    H->v1 = H->v1 << 0xd | H->v1 >> 0x33;
    H->v1 = H->v0 ^ H->v1;
    H->v0 = H->v0 << 0x20 | H->v0 >> 0x20;
    H->v2 = H->v3 + H->v2;
    H->v3 = H->v3 << 0x10 | H->v3 >> 0x30;
    H->v3 = H->v2 ^ H->v3;
    H->v0 = H->v3 + H->v0;
    H->v3 = H->v3 << 0x15 | H->v3 >> 0x2b;
    H->v3 = H->v0 ^ H->v3;
    H->v2 = H->v1 + H->v2;
    H->v1 = H->v1 << 0x11 | H->v1 >> 0x2f;
    H->v1 = H->v2 ^ H->v1;
    H->v2 = H->v2 << 0x20 | H->v2 >> 0x20;
  }
  return;
}

Assistant:

static void
sip_round(struct siphash *H, const int rounds) {
  int i;

  for (i = 0; i < rounds; i++) {
    H->v0 += H->v1;
    H->v1 = SIP_ROTL(H->v1, 13);
    H->v1 ^= H->v0;
    H->v0 = SIP_ROTL(H->v0, 32);

    H->v2 += H->v3;
    H->v3 = SIP_ROTL(H->v3, 16);
    H->v3 ^= H->v2;

    H->v0 += H->v3;
    H->v3 = SIP_ROTL(H->v3, 21);
    H->v3 ^= H->v0;

    H->v2 += H->v1;
    H->v1 = SIP_ROTL(H->v1, 17);
    H->v1 ^= H->v2;
    H->v2 = SIP_ROTL(H->v2, 32);
  }
}